

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

uint32_t Catch::Generators::Detail::getSeed(void)

{
  uint uVar1;
  byte bVar2;
  
  sharedRng();
  uVar1 = (uint)(sharedRng::s_rng.m_state >> 0x2d) ^ (uint)(sharedRng::s_rng.m_state >> 0x1b);
  bVar2 = (byte)(sharedRng::s_rng.m_state >> 0x3b);
  sharedRng::s_rng.m_state = sharedRng::s_rng.m_state * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
  return uVar1 >> bVar2 | uVar1 << 0x20 - bVar2;
}

Assistant:

std::uint32_t getSeed() { return sharedRng()(); }